

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O3

Expression *
slang::ast::Expression::bindLValue
          (ExpressionSyntax *syntax,ASTContext *context,bitmask<slang::ast::AssignFlags> assignFlags
          )

{
  Compilation *this;
  bool bVar1;
  InvalidExpression *this_00;
  InvalidExpression *local_20;
  
  this_00 = (InvalidExpression *)
            selfDetermined(((context->scope).ptr)->compilation,syntax,context,
                           (bitmask<slang::ast::ASTFlags>)((context->flags).m_bits | 0x100000));
  bVar1 = requireLValue((Expression *)this_00,context,(SourceLocation)0x0,assignFlags,
                        (Expression *)0x0);
  if (!bVar1) {
    this = ((context->scope).ptr)->compilation;
    local_20 = this_00;
    this_00 = BumpAllocator::
              emplace<slang::ast::InvalidExpression,slang::ast::Expression_const*&,slang::ast::Type_const&>
                        (&this->super_BumpAllocator,(Expression **)&local_20,this->errorType);
  }
  return &this_00->super_Expression;
}

Assistant:

const Expression& Expression::bindLValue(const ExpressionSyntax& syntax, const ASTContext& context,
                                         bitmask<AssignFlags> assignFlags) {
    auto& expr = bind(syntax, context, ASTFlags::LValue);
    if (!expr.requireLValue(context, {}, assignFlags))
        return badExpr(context.getCompilation(), &expr);
    return expr;
}